

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::directory_iterator::impl::~impl(impl *this)

{
  if ((DIR *)this->_dir != (DIR *)0x0) {
    closedir((DIR *)this->_dir);
  }
  std::__cxx11::string::~string((string *)&this->_dir_entry);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~impl()
    {
        if (_dir) {
            ::closedir(_dir);
        }
    }